

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junction.cpp
# Opt level: O0

void __thiscall Junction::convertUnits(Junction *this,Network *nw)

{
  bool bVar1;
  size_type sVar2;
  reference pDVar3;
  double dVar4;
  double pUcf;
  Demand *demand;
  iterator __end1;
  iterator __begin1;
  list<Demand,_std::allocator<Demand>_> *__range1;
  double qcf;
  Network *nw_local;
  Junction *this_local;
  
  dVar4 = Network::ucf(nw,LENGTH);
  (this->super_Node).elev = (this->super_Node).elev / dVar4;
  dVar4 = Network::ucf(nw,CONCEN);
  (this->super_Node).initQual = (this->super_Node).initQual / dVar4;
  sVar2 = std::__cxx11::list<Demand,_std::allocator<Demand>_>::size(&this->demands);
  if (sVar2 == 0) {
    std::__cxx11::list<Demand,_std::allocator<Demand>_>::push_back
              (&this->demands,&this->primaryDemand);
  }
  dVar4 = Network::ucf(nw,FLOW);
  __end1 = std::__cxx11::list<Demand,_std::allocator<Demand>_>::begin(&this->demands);
  demand = (Demand *)std::__cxx11::list<Demand,_std::allocator<Demand>_>::end(&this->demands);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&demand);
    if (!bVar1) break;
    pDVar3 = std::_List_iterator<Demand>::operator*(&__end1);
    pDVar3->baseDemand = pDVar3->baseDemand / dVar4;
    std::_List_iterator<Demand>::operator++(&__end1);
  }
  if (this->emitter != (Emitter *)0x0) {
    Emitter::convertUnits(this->emitter,nw);
  }
  if ((this->pMin == -999999999.9) && (!NAN(this->pMin))) {
    dVar4 = Network::option(nw,MINIMUM_PRESSURE);
    this->pMin = dVar4;
  }
  if ((this->pFull == -999999999.9) && (!NAN(this->pFull))) {
    dVar4 = Network::option(nw,SERVICE_PRESSURE);
    this->pFull = dVar4;
  }
  dVar4 = Network::ucf(nw,PRESSURE);
  this->pMin = this->pMin / dVar4;
  this->pFull = this->pFull / dVar4;
  return;
}

Assistant:

void Junction::convertUnits(Network* nw)
{
    // ... convert elevation & initial quality units

    elev /= nw->ucf(Units::LENGTH);
    initQual /= nw->ucf(Units::CONCEN);

    // ... if no demand categories exist, add primary demand to list

    if (demands.size() == 0) demands.push_back(primaryDemand);

    // ... convert flow units for base demand in each demand category

    double qcf = nw->ucf(Units::FLOW);
    for (Demand& demand : demands)
    {
        demand.baseDemand /= qcf;
    }

    // ... convert emitter flow units

    if (emitter) emitter->convertUnits(nw);

    // ... use global pressure limits if no local limits assigned

    if ( pMin == MISSING )  pMin = nw->option(Options::MINIMUM_PRESSURE);
    if ( pFull == MISSING ) pFull = nw->option(Options::SERVICE_PRESSURE);

    // ... convert units of pressure limits

    double pUcf = nw->ucf(Units::PRESSURE);
    pMin /= pUcf;
    pFull /= pUcf;
}